

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkRange
               (TestLog *log,vector<unsigned_int,_std::allocator<unsigned_int>_> *values,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *min,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *max)

{
  ostringstream *this;
  int iVar1;
  pointer puVar2;
  MessageBuilder *pMVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 local_1b0 [384];
  
  lVar6 = 0;
  iVar4 = 0;
  for (lVar5 = 0;
      puVar2 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start, local_1b0._0_8_ = log,
      lVar5 < (int)((ulong)((long)(values->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2);
      lVar5 = lVar5 + 1) {
    iVar1 = *(int *)((long)puVar2 + lVar6);
    if ((iVar1 != -1) &&
       ((iVar1 < *(int *)((long)(min->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar6) ||
        (*(int *)((long)(max->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar6) < iVar1)))) {
      if (iVar4 < 0x14) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Value ");
        pMVar3 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,
                            (uint *)((long)(values->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar6));
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        " not in range [");
        pMVar3 = tcu::MessageBuilder::operator<<
                           (pMVar3,(uint *)((long)(min->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar6
                                           ));
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar3 = tcu::MessageBuilder::operator<<
                           (pMVar3,(uint *)((long)(max->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar6
                                           ));
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].");
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      }
      iVar4 = iVar4 + 1;
    }
    lVar6 = lVar6 + 4;
  }
  if (0x14 < iVar4) {
    this = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Number of values not in range: ");
    std::ostream::operator<<(this,iVar4);
    std::operator<<((ostream *)this,", displaying first 20 values.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
  }
  return iVar4 == 0;
}

Assistant:

bool AtomicCounterTest::checkRange (TestLog& log, const vector<deUint32>& values, const vector<deUint32>& min, const vector<deUint32>& max)
{
	int failedCount = 0;

	DE_ASSERT(values.size() == min.size());
	DE_ASSERT(values.size() == max.size());

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
		{
			if (!deInRange32(values[valueNdx], min[valueNdx], max[valueNdx]))
			{
				if (failedCount < 20)
					log << TestLog::Message << "Value " << values[valueNdx] << " not in range [" << min[valueNdx] << ", " << max[valueNdx] << "]." << TestLog::EndMessage;
				failedCount++;
			}
		}
	}

	if (failedCount > 20)
		log << TestLog::Message << "Number of values not in range: " << failedCount << ", displaying first 20 values." << TestLog::EndMessage;

	return failedCount == 0;
}